

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void reportLp(HighsLogOptions *log_options,HighsLp *lp,HighsLogType report_level)

{
  int in_EDX;
  HighsLogOptions *in_RSI;
  HighsLp *in_stack_00000088;
  HighsLogOptions *in_stack_00000090;
  HighsLp *in_stack_000000c8;
  HighsLogOptions *in_stack_000000d0;
  HighsLp *in_stack_000000d8;
  HighsLogOptions *in_stack_000000e0;
  undefined4 in_stack_ffffffffffffffe8;
  
  reportLpBrief(in_RSI,(HighsLp *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  if (1 < in_EDX) {
    reportLpColVectors(in_stack_000000d0,in_stack_000000c8);
    reportLpRowVectors(in_stack_000000e0,in_stack_000000d8);
    if (2 < in_EDX) {
      reportLpColMatrix(in_stack_00000090,in_stack_00000088);
    }
  }
  return;
}

Assistant:

void reportLp(const HighsLogOptions& log_options, const HighsLp& lp,
              const HighsLogType report_level) {
  reportLpBrief(log_options, lp);
  if ((HighsInt)report_level >= (HighsInt)HighsLogType::kDetailed) {
    reportLpColVectors(log_options, lp);
    reportLpRowVectors(log_options, lp);
    if ((HighsInt)report_level >= (HighsInt)HighsLogType::kVerbose)
      reportLpColMatrix(log_options, lp);
  }
}